

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_optimizer.c
# Opt level: O1

gravity_function_t * gravity_optimizer(gravity_function_t *f,_Bool add_debug)

{
  optag_t oVar1;
  optag_t oVar2;
  opcode_t oVar3;
  ircode_t *piVar4;
  bool bVar5;
  bool bVar6;
  _Bool _Var7;
  uint8_t uVar8;
  _Bool _Var9;
  uint16_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  gravity_function_t *inst;
  inst_t *piVar16;
  inst_t *piVar17;
  inst_t *piVar18;
  long lVar19;
  inst_t *piVar20;
  inst_t *piVar21;
  gravity_hash_t *hashtable;
  uint32_t *puVar22;
  gravity_value_t *pgVar23;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar24;
  uint uVar25;
  gravity_class_t *pgVar26;
  gravity_function_t *pgVar27;
  size_t size;
  uint uVar28;
  optag_t oVar29;
  uint32_t uVar30;
  long lVar31;
  char cVar32;
  int iVar33;
  undefined7 uVar36;
  ulong uVar34;
  ulong uVar35;
  uint32_t i;
  bool bVar37;
  float fVar38;
  double dVar39;
  gravity_value_t v;
  gravity_value_t key;
  gravity_value_t key_00;
  gravity_value_t key_01;
  gravity_value_t value;
  double local_60;
  double local_58;
  uint32_t *local_48;
  
  piVar4 = *(ircode_t **)((long)&f->field_9 + 0x50);
  if (piVar4 != (ircode_t *)0x0) {
    uVar11 = ircode_count(piVar4);
    uVar12 = ircode_ntemps(piVar4);
    f->ntemps = (uint16_t)uVar12;
    if (uVar11 != 0) {
      piVar17 = (inst_t *)0x0;
      inst = f;
      bVar37 = true;
LAB_0010b05a:
      do {
        bVar5 = bVar37;
        iVar33 = (int)piVar17;
        pgVar27 = inst;
        piVar16 = piVar17;
        do {
          inst = (gravity_function_t *)ircode_get(piVar4,(uint32_t)piVar16);
          if (inst == (gravity_function_t *)0x0) {
            inst = (gravity_function_t *)0x0;
            bVar37 = false;
          }
          else if (*(optag_t *)((long)&inst->isa + 4) == SKIP_TAG) {
            piVar16 = (inst_t *)(ulong)((uint32_t)piVar16 + 1);
            bVar37 = true;
            inst = pgVar27;
          }
          else {
            bVar37 = false;
          }
          pgVar27 = inst;
        } while (bVar37);
        if ((inst == (gravity_function_t *)0x0) || (*(opcode_t *)&inst->isa != NEG)) {
LAB_0010b121:
          bVar37 = false;
        }
        else {
          if (-1 < iVar33 + -1) {
            do {
              uVar28 = (int)piVar17 - 1;
              piVar17 = (inst_t *)(ulong)uVar28;
              piVar16 = ircode_get(piVar4,uVar28);
              if ((piVar16 != (inst_t *)0x0) && (piVar16->tag != SKIP_TAG)) goto LAB_0010b0c4;
            } while (0 < (int)uVar28);
          }
          piVar16 = (inst_t *)0x0;
LAB_0010b0c4:
          if ((((piVar16 == (inst_t *)0x0) || (piVar16->op != LOADI)) ||
              (piVar16->p1 != *(uint32_t *)&(inst->gc).field_0x4)) ||
             (_Var7 = ircode_register_istemp(piVar4,piVar16->p1), !_Var7)) {
LAB_0010b114:
            bVar37 = false;
          }
          else {
            if (piVar16->tag == DOUBLE_TAG) {
              piVar16->p1 = *(int32_t *)&(inst->gc).field_0x4;
              (piVar16->field_5).n = (piVar16->field_5).n ^ 0x8000000000000000;
            }
            else {
              if ((piVar16->tag != INT_TAG) || (0x20000 < (piVar16->field_5).n)) goto LAB_0010b114;
              piVar16->p1 = *(int32_t *)&(inst->gc).field_0x4;
              (piVar16->field_5).n = -(piVar16->field_5).n;
            }
            inst_setskip((inst_t *)inst);
            bVar37 = true;
          }
          if (!bVar37) goto LAB_0010b121;
        }
        if (!bVar37) {
          uVar28 = iVar33 + 1;
          piVar17 = (inst_t *)(ulong)uVar28;
          bVar37 = uVar28 < uVar11;
          if (uVar28 == uVar11) break;
          goto LAB_0010b05a;
        }
        piVar17 = (inst_t *)0x0;
        bVar37 = true;
      } while (bVar5);
      piVar16 = (inst_t *)0x0;
      bVar37 = true;
LAB_0010b183:
      do {
        bVar5 = bVar37;
        iVar33 = (int)piVar16;
        piVar18 = piVar16;
        piVar20 = piVar17;
        do {
          piVar17 = ircode_get(piVar4,(uint32_t)piVar18);
          if (piVar17 == (inst_t *)0x0) {
            piVar17 = (inst_t *)0x0;
            bVar37 = false;
          }
          else if (piVar17->tag == SKIP_TAG) {
            piVar18 = (inst_t *)(ulong)((uint32_t)piVar18 + 1);
            bVar37 = true;
            piVar17 = piVar20;
          }
          else {
            bVar37 = false;
          }
          piVar20 = piVar17;
        } while (bVar37);
        if ((piVar17 == (inst_t *)0x0) || (4 < piVar17->op - ADD)) goto LAB_0010b444;
        uVar8 = opcode_numop(piVar17->op);
        uVar28 = iVar33 - 1;
        piVar18 = (inst_t *)(ulong)uVar28;
        if (uVar8 != '\x03') {
          if (-1 < (int)uVar28) {
            do {
              uVar12 = (uint32_t)piVar18;
              piVar16 = ircode_get(piVar4,uVar12);
              if (piVar16 == (inst_t *)0x0) {
                if ((int)uVar12 < 1) break;
              }
              else {
                bVar37 = false;
                if (((int)uVar12 < 1) || (piVar16->tag != SKIP_TAG)) goto LAB_0010b431;
              }
              piVar18 = (inst_t *)(ulong)(uVar12 - 1);
            } while( true );
          }
          bVar37 = false;
          goto LAB_0010b431;
        }
        if ((int)uVar28 < 0) {
          piVar18 = (inst_t *)0x0;
          piVar20 = (inst_t *)0x0;
        }
        else {
          piVar20 = (inst_t *)0x0;
          do {
            uVar28 = (int)piVar16 - 1;
            piVar16 = (inst_t *)(ulong)uVar28;
            piVar18 = ircode_get(piVar4,uVar28);
            piVar21 = piVar20;
            if (((piVar18 != (inst_t *)0x0) && (piVar18->tag != SKIP_TAG)) &&
               (piVar21 = piVar18, piVar20 != (inst_t *)0x0)) goto LAB_0010b252;
            piVar20 = piVar21;
          } while (0 < (int)uVar28);
          piVar18 = (inst_t *)0x0;
        }
LAB_0010b252:
        if (((piVar18 == (inst_t *)0x0) || (piVar20 == (inst_t *)0x0 || piVar18->op != LOADI)) ||
           (piVar20->op != LOADI)) {
LAB_0010b386:
          bVar37 = false;
          goto LAB_0010b388;
        }
        oVar1 = piVar18->tag;
        oVar2 = piVar20->tag;
        oVar29 = DOUBLE_TAG;
        if (oVar1 == oVar2) {
          oVar29 = oVar1;
        }
        if ((piVar17->p2 != piVar18->p1) || (piVar17->p3 != piVar20->p2)) goto LAB_0010b386;
        if (oVar29 == DOUBLE_TAG) {
          if (oVar1 == INT_TAG) {
            local_60 = (double)(piVar18->field_5).n;
          }
          else {
            local_60 = (piVar18->field_5).d;
          }
          if (oVar2 == INT_TAG) {
            dVar39 = (double)(piVar20->field_5).n;
          }
          else {
            dVar39 = (piVar20->field_5).d;
          }
          lVar19 = 0;
          lVar31 = 0;
        }
        else {
          if (oVar1 == INT_TAG) {
            lVar19 = (piVar18->field_5).n;
          }
          else {
            lVar19 = (long)(piVar18->field_5).d;
          }
          if (oVar2 == INT_TAG) {
            lVar31 = (piVar20->field_5).n;
          }
          else {
            lVar31 = (long)(piVar20->field_5).d;
          }
          local_60 = 0.0;
          dVar39 = 0.0;
        }
        switch(piVar17->op) {
        case ADD:
          if (oVar29 == DOUBLE_TAG) {
            local_60 = local_60 + dVar39;
            goto LAB_0010b490;
          }
          local_58 = (double)(lVar31 + lVar19);
LAB_0010b4a4:
          local_60 = 0.0;
          break;
        case SUB:
          if (oVar29 == DOUBLE_TAG) {
            local_60 = local_60 - dVar39;
            goto LAB_0010b490;
          }
          local_58 = (double)(lVar19 - lVar31);
LAB_0010b4d5:
          local_60 = 0.0;
          break;
        case DIV:
          if ((long)dVar39 == 0) goto LAB_0010b386;
          if (oVar29 != DOUBLE_TAG) {
            local_58 = (double)(lVar19 / lVar31);
            goto LAB_0010b4d5;
          }
          local_60 = local_60 / dVar39;
          goto LAB_0010b490;
        case MUL:
          if (oVar29 != DOUBLE_TAG) {
            local_58 = (double)(lVar31 * lVar19);
            goto LAB_0010b4a4;
          }
          local_60 = local_60 * dVar39;
LAB_0010b490:
          local_58 = 0.0;
          break;
        case REM:
          if ((long)dVar39 == 0) goto LAB_0010b386;
          if (oVar29 == DOUBLE_TAG) {
            local_60 = (double)((long)local_60 % (long)dVar39);
            goto LAB_0010b490;
          }
          local_58 = (double)(lVar19 % lVar31);
          local_60 = 0.0;
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                        ,0x154,"_Bool optimize_const_instruction(inst_t *, inst_t *, inst_t *)");
        }
        inst_setskip(piVar18);
        inst_setskip(piVar20);
        piVar17->op = LOADI;
        piVar17->tag = oVar29;
        piVar17->p2 = 0;
        piVar17->p3 = 0;
        if (oVar29 == DOUBLE_TAG) {
          (piVar17->field_5).d = local_60;
        }
        else {
          (piVar17->field_5).d = local_58;
        }
        bVar37 = true;
LAB_0010b388:
        if ((piVar20 != (inst_t *)0x0) && (piVar20->op == MOVE)) {
          _Var7 = ircode_register_istemp(piVar4,piVar17->p3);
          _Var9 = ircode_register_istemp(piVar4,piVar20->p1);
          if ((_Var7) && ((_Var9 && (piVar17->p3 == piVar20->p1)))) {
            piVar17->p3 = piVar20->p2;
            inst_setskip(piVar20);
            bVar37 = true;
          }
        }
        if ((piVar18 != (inst_t *)0x0) && (piVar18->op == MOVE)) {
          _Var7 = ircode_register_istemp(piVar4,piVar17->p2);
          _Var9 = ircode_register_istemp(piVar4,piVar18->p1);
          if ((_Var7) && ((_Var9 && (piVar17->p2 == piVar18->p1)))) {
            piVar17->p2 = piVar18->p2;
            inst_setskip(piVar18);
            bVar37 = true;
          }
        }
LAB_0010b431:
        if (bVar37) {
          iVar13 = 6;
        }
        else {
LAB_0010b444:
          iVar13 = 0;
        }
        if (iVar13 == 0) {
          uVar28 = iVar33 + 1;
          piVar16 = (inst_t *)(ulong)uVar28;
          bVar37 = uVar28 < uVar11;
          if (uVar28 == uVar11) break;
          goto LAB_0010b183;
        }
        piVar16 = (inst_t *)0x0;
        bVar37 = true;
      } while (bVar5);
      uVar30 = 0;
      piVar17 = (inst_t *)0x1;
      uVar12 = uVar30;
      bVar37 = true;
LAB_0010b537:
      do {
        do {
          bVar5 = bVar37;
          piVar20 = ircode_get(piVar4,uVar30);
          if (piVar20 == (inst_t *)0x0) {
            piVar20 = (inst_t *)0x0;
            bVar6 = false;
          }
          else if (piVar20->tag == SKIP_TAG) {
            uVar30 = uVar30 + 1;
            bVar6 = true;
            piVar20 = piVar18;
          }
          else {
            bVar6 = false;
          }
          piVar18 = piVar20;
          bVar37 = bVar5;
        } while (bVar6);
        if ((piVar20 != (inst_t *)0x0) && (piVar20->tag == PRAGMA_MOVE_OPTIMIZATION)) {
          piVar17 = (inst_t *)CONCAT71((int7)((ulong)piVar17 >> 8),piVar20->p1 != 0);
        }
        if (((piVar20 == (inst_t *)0x0) || (((ulong)piVar17 & 1) == 0)) || (piVar20->op != MOVE)) {
LAB_0010b62c:
          iVar33 = 0;
        }
        else {
          uVar30 = uVar12;
          if (-1 < (int)(uVar12 - 1)) {
            do {
              uVar30 = uVar30 - 1;
              piVar21 = ircode_get(piVar4,uVar30);
              if ((piVar21 != (inst_t *)0x0) && (piVar21->tag != SKIP_TAG)) goto LAB_0010b5c0;
            } while (0 < (int)uVar30);
          }
          piVar21 = (inst_t *)0x0;
LAB_0010b5c0:
          if ((piVar21 == (inst_t *)0x0) || (2 < piVar21->op - LOADK)) {
LAB_0010b614:
            bVar37 = false;
          }
          else {
            _Var7 = ircode_register_istemp(piVar4,piVar20->p2);
            _Var9 = ircode_register_istemp(piVar4,piVar21->p1);
            bVar37 = false;
            if ((_Var7) && (bVar37 = false, _Var9)) {
              if (piVar20->p2 != piVar21->p1) goto LAB_0010b614;
              piVar21->p1 = piVar20->p1;
              inst_setskip(piVar20);
              bVar37 = true;
            }
          }
          iVar33 = 0;
          if (bVar37) {
            iVar33 = 10;
          }
          piVar17 = (inst_t *)CONCAT71((int7)((ulong)piVar21 >> 8),(char)piVar17);
          if (!bVar37) goto LAB_0010b62c;
        }
        if (iVar33 == 0) {
          uVar30 = uVar12 + 1;
          uVar12 = uVar30;
          bVar37 = uVar30 < uVar11;
          if (uVar30 == uVar11) break;
          goto LAB_0010b537;
        }
        uVar30 = 0;
        piVar17 = (inst_t *)CONCAT71((int7)((ulong)piVar17 >> 8),1);
        uVar12 = uVar30;
        bVar37 = true;
      } while (bVar5);
      uVar30 = 0;
      piVar16 = (inst_t *)CONCAT71((int7)((ulong)piVar16 >> 8),1);
      uVar12 = uVar30;
LAB_0010b662:
      do {
        do {
          piVar18 = ircode_get(piVar4,uVar30);
          if (piVar18 == (inst_t *)0x0) {
            piVar18 = (inst_t *)0x0;
            bVar37 = false;
          }
          else if (piVar18->tag == SKIP_TAG) {
            uVar30 = uVar30 + 1;
            bVar37 = true;
            piVar18 = piVar17;
          }
          else {
            bVar37 = false;
          }
          piVar17 = piVar18;
        } while (bVar37);
        if ((piVar18 == (inst_t *)0x0) || (piVar18->op != RET)) {
LAB_0010b711:
          iVar33 = 0;
        }
        else {
          uVar30 = uVar12;
          if (-1 < (int)(uVar12 - 1)) {
            do {
              uVar30 = uVar30 - 1;
              piVar20 = ircode_get(piVar4,uVar30);
              if ((piVar20 != (inst_t *)0x0) && (piVar20->tag != SKIP_TAG)) goto LAB_0010b6c3;
            } while (0 < (int)uVar30);
          }
          piVar20 = (inst_t *)0x0;
LAB_0010b6c3:
          _Var7 = ircode_register_istemp(piVar4,piVar18->p1);
          bVar37 = false;
          if ((piVar20 != (inst_t *)0x0) && (bVar37 = false, _Var7)) {
            if ((piVar20->op == MOVE) && (piVar18->p1 == piVar20->p1)) {
              piVar18->p1 = piVar20->p2;
              inst_setskip(piVar20);
              bVar37 = true;
            }
            else {
              bVar37 = false;
            }
          }
          if (!bVar37) goto LAB_0010b711;
          iVar33 = 0xe;
        }
        uVar36 = (undefined7)((ulong)piVar16 >> 8);
        if (iVar33 == 0) {
          uVar30 = uVar12 + 1;
          piVar16 = (inst_t *)CONCAT71(uVar36,uVar30 < uVar11);
          uVar12 = uVar30;
          if (uVar30 == uVar11) break;
          goto LAB_0010b662;
        }
        uVar30 = 0;
        cVar32 = (char)piVar16;
        piVar16 = (inst_t *)CONCAT71(uVar36,1);
        uVar12 = uVar30;
      } while (cVar32 != '\0');
      uVar30 = 0;
      uVar12 = uVar30;
      do {
        do {
          piVar17 = ircode_get(piVar4,uVar30);
          if (piVar17 == (inst_t *)0x0) {
            piVar17 = (inst_t *)0x0;
            bVar37 = false;
          }
          else if (piVar17->tag == SKIP_TAG) {
            uVar30 = uVar30 + 1;
            bVar37 = true;
            piVar17 = piVar16;
          }
          else {
            bVar37 = false;
          }
          piVar16 = piVar17;
        } while (bVar37);
        if ((piVar17 != (inst_t *)0x0) && (piVar17->op == LOADI)) {
          oVar1 = piVar17->tag;
          bVar37 = oVar1 == DOUBLE_TAG;
          if (oVar1 == INT_TAG) {
            bVar37 = (piVar17->field_5).n - 0x20001U < 0xfffffffffffc0000;
          }
          if (bVar37) {
            if (oVar1 == INT_TAG) {
              aVar24 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(piVar17->field_5).n;
              pgVar26 = gravity_class_int;
            }
            else {
              aVar24 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(piVar17->field_5).n;
              pgVar26 = gravity_class_float;
            }
            v.field_1.n = aVar24.n;
            v.isa = pgVar26;
            uVar10 = gravity_function_cpool_add((gravity_vm *)0x0,f,v);
            piVar17->op = LOADK;
            piVar17->tag = NO_TAG;
            piVar17->p2 = (uint)uVar10;
          }
        }
        uVar30 = uVar12 + 1;
        uVar12 = uVar30;
      } while (uVar30 != uVar11);
    }
    piVar4 = (ircode_t *)(f->field_9).field_0.bytecode;
    uVar11 = ircode_count(piVar4);
    uVar28 = 0;
    hashtable = gravity_hash_create(0,hash_compute,hash_isequal,(gravity_hash_iterate_fn)0x0,
                                    (void *)0x0);
    if (uVar11 != 0) {
      aVar24.n = 0;
      uVar12 = 0;
      do {
        piVar17 = ircode_get(piVar4,uVar12);
        oVar1 = piVar17->tag;
        if ((oVar1 != SKIP_TAG) && (piVar17 == (inst_t *)0x0 || oVar1 != PRAGMA_MOVE_OPTIMIZATION))
        {
          if (oVar1 == LABEL_TAG) {
            key.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)piVar17->p1;
            key.isa = gravity_class_int;
            value.field_1.n = aVar24.n;
            value.isa = gravity_class_int;
            gravity_hash_insert(hashtable,key,value);
          }
          else {
            aVar24._0_4_ = (int)aVar24.n + 1;
            aVar24.n._4_4_ = 0;
          }
        }
        uVar28 = (uint)aVar24.n;
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
    (f->field_9).field_0.ninsts = uVar28;
    size = (ulong)(uVar28 + 1) << 2;
    local_48 = (uint32_t *)0x0;
    puVar22 = (uint32_t *)gravity_calloc((gravity_vm *)0x0,1,size);
    if (add_debug) {
      local_48 = (uint32_t *)gravity_calloc((gravity_vm *)0x0,1,size);
    }
    if (puVar22 == (uint32_t *)0x0) {
      __assert_fail("bytecode",
                    "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                    ,0x4d,"void finalize_function(gravity_function_t *, _Bool)");
    }
    if (uVar11 == 0) {
      iVar33 = 0;
    }
    else {
      iVar33 = 0;
      uVar12 = 0;
      uVar34 = 0;
      do {
        piVar17 = ircode_get(piVar4,uVar12);
        oVar1 = piVar17->tag;
        uVar35 = uVar34;
        if ((oVar1 - LABEL_TAG < 2) ||
           (piVar17 != (inst_t *)0x0 && oVar1 == PRAGMA_MOVE_OPTIMIZATION)) goto LAB_0010bb41;
        oVar3 = piVar17->op;
        switch(oVar3) {
        case RET0:
        case HALT:
        case NOP:
          uVar15 = oVar3 << 0x1a;
          break;
        case RET:
          uVar15 = (piVar17->p1 & 0xffU) << 0x12 | 0xc000000;
          break;
        case CALL:
          uVar15 = (piVar17->p3 & 0x3ffU) +
                   ((piVar17->p2 & 0xffU) << 10 | (piVar17->p1 & 0xffU) << 0x12) + 0x10000000;
          break;
        case LOAD:
        case STORE:
          iVar33 = iVar33 + 1;
        case LOADS:
        case LOADAT:
        case STOREAT:
        case ADD:
        case SUB:
        case DIV:
        case MUL:
        case REM:
        case AND:
        case OR:
        case LT:
        case GT:
        case EQ:
        case LEQ:
        case GEQ:
        case NEQ:
        case EQQ:
        case NEQQ:
        case ISA:
        case MATCH:
        case NEG:
        case NOT:
        case LSHIFT:
        case RSHIFT:
        case BAND:
        case BOR:
        case BXOR:
        case BNOT:
          uVar15 = piVar17->p3 & 0x3ffU |
                   (piVar17->p2 & 0xffU) << 10 | (piVar17->p1 & 0xffU) << 0x12 | oVar3 << 0x1a;
          break;
        case LOADG:
        case LOADU:
        case STOREG:
        case STOREU:
          iVar33 = iVar33 + 1;
        case LOADK:
        case MOVE:
        case MAPNEW:
        case LISTNEW:
        case CLOSURE:
        case CLOSE:
          uVar15 = (piVar17->p1 & 0xffU) << 0x12 | oVar3 << 0x1a;
          uVar14 = piVar17->p2;
          uVar25 = 0x3ffff;
          goto LAB_0010b988;
        case LOADI:
          uVar15 = ((uint)((ulong)(piVar17->field_5).n >> 0x2e) & 0x20000) +
                   ((uint)(piVar17->field_5).n & 0x1ffff | (piVar17->p1 & 0xffU) << 0x12) +
                   0x28000000;
          break;
        case JUMP:
          key_00.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)piVar17->p1;
          key_00.isa = gravity_class_int;
          pgVar23 = gravity_hash_lookup(hashtable,key_00);
          if (pgVar23 == (gravity_value_t *)0x0) {
            __assert_fail("v",
                          "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                          ,0x94,"void finalize_function(gravity_function_t *, _Bool)");
          }
          uVar15 = piVar17->op << 0x1a;
          uVar14 = *(uint *)&pgVar23->field_1;
          uVar25 = 0x3ffffff;
          goto LAB_0010b988;
        case JUMPF:
          key_01.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)piVar17->p2;
          key_01.isa = gravity_class_int;
          pgVar23 = gravity_hash_lookup(hashtable,key_01);
          if (pgVar23 == (gravity_value_t *)0x0) {
            __assert_fail("v",
                          "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                          ,0x86,"void finalize_function(gravity_function_t *, _Bool)");
          }
          uVar15 = (piVar17->p3 & 1U) << 0x11 | (piVar17->p1 & 0xffU) << 0x12 | piVar17->op << 0x1a;
          uVar14 = *(uint *)&pgVar23->field_1;
          uVar25 = 0x1ffff;
LAB_0010b988:
          uVar15 = uVar14 & uVar25 | uVar15;
          break;
        case SWITCH:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                        ,0xbb,"void finalize_function(gravity_function_t *, _Bool)");
        case RANGENEW:
          uVar15 = ((uint)(oVar1 != RANGE_INCLUDE_TAG) | (piVar17->p1 & 0xffU) << 0x12 |
                   (piVar17->p2 & 0xffU) << 10) + (piVar17->p3 & 0xffU) * 4 + 0xbc000000;
          break;
        case SETLIST:
          uVar15 = (piVar17->p3 & 0x3ffU) +
                   ((piVar17->p2 & 0xffU) << 10 | (piVar17->p1 & 0xffU) << 0x12) + 0xc0000000;
          break;
        case CHECK:
          uVar15 = (piVar17->p1 & 0xffU) * 0x40000 + (piVar17->p2 & 0x3ffffU) + 0xcc000000;
          break;
        case RESERVED2:
        case RESERVED3:
        case RESERVED4:
        case RESERVED5:
        case RESERVED6:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_optimizer.c"
                        ,0xcc,"void finalize_function(gravity_function_t *, _Bool)");
        default:
          uVar15 = 0;
        }
        if (add_debug) {
          local_48[uVar34] = piVar17->lineno;
        }
        uVar35 = (ulong)((int)uVar34 + 1);
        puVar22[uVar34] = uVar15;
LAB_0010bb41:
        uVar12 = uVar12 + 1;
        uVar34 = uVar35;
      } while (uVar11 != uVar12);
    }
    ircode_free(piVar4);
    gravity_hash_free(hashtable);
    (f->field_9).field_0.bytecode = puVar22;
    (f->field_9).field_0.lineno = local_48;
    if (iVar33 == 0) {
      fVar38 = 1.0;
    }
    else {
      fVar38 = ((float)(uint)(iVar33 * 100) / (float)uVar28) / 100.0;
    }
    (f->field_9).field_0.purity = fVar38;
  }
  return f;
}

Assistant:

gravity_function_t *gravity_optimizer(gravity_function_t *f, bool add_debug) {
    if (f->bytecode == NULL) return f;

    ircode_t    *code = (ircode_t *)f->bytecode;
    uint32_t    count = ircode_count(code);
    bool        optimizer = true;

    f->ntemps = ircode_ntemps(code);

    loop_neg:
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_NEG(inst)) {
            bool b = optimize_neg_instruction (code, inst, i);
            if (b) goto loop_neg;
        }
    }

    loop_math:
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_MATH(inst)) {
            bool b = optimize_math_instruction (code, inst, i);
            if (b) goto loop_math;
        }
    }

    loop_move:
    optimizer = true;
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_PRAGMA_MOVE_OPT(inst)) optimizer = (bool)inst->p1;
        if (optimizer && IS_MOVE(inst)) {
            bool b = optimize_move_instruction (code, inst, i);
            if (b) goto loop_move;
        }
    }

    loop_ret:
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_RET(inst)) {
            bool b = optimize_return_instruction (code, inst, i);
            if (b) goto loop_ret;
        }
    }

    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = current_instruction(code, i);
        if (IS_NUM(inst)) optimize_num_instruction (inst, f);
    }

    // dump optimized version
    #if GRAVITY_BYTECODE_DEBUG
    gravity_function_dump(f, ircode_dump);
    #endif

    // finalize function
	finalize_function(f, add_debug);

    return f;
}